

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSignal_POSIX.c
# Opt level: O0

UINT8 OSSignal_Signal(OS_SIGNAL *sig)

{
  int iVar1;
  int retVal;
  OS_SIGNAL *sig_local;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)sig);
  if (iVar1 == 0) {
    sig->state = '\x01';
    pthread_cond_signal((pthread_cond_t *)&sig->hCond);
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)sig);
    sig_local._7_1_ = '\0';
    if (iVar1 != 0) {
      sig_local._7_1_ = 0xff;
    }
  }
  else {
    sig_local._7_1_ = 0xff;
  }
  return sig_local._7_1_;
}

Assistant:

UINT8 OSSignal_Signal(OS_SIGNAL* sig)
{
	int retVal;
	
	retVal = pthread_mutex_lock(&sig->hMutex);
	if (retVal)
		return 0xFF;
	
	sig->state = 1;
	pthread_cond_signal(&sig->hCond);
	
	retVal = pthread_mutex_unlock(&sig->hMutex);
	return retVal ? 0xFF : 0x00;
}